

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O2

int cvLsDQJac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,void *cvode_mem,N_Vector tmp1,
             N_Vector tmp2,N_Vector tmp3)

{
  long lVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (cvode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    error_code = -1;
    cvode_mem = (CVodeMem)0x0;
    iVar2 = 0x42b;
  }
  else if (Jac == (SUNMatrix)0x0) {
    msgfmt = "Linear solver memory is NULL.";
    error_code = -2;
    iVar2 = 0x434;
  }
  else {
    lVar1 = *(long *)(*(long *)((long)cvode_mem + 0x1d0) + 8);
    if ((((*(long *)(lVar1 + 0x10) == 0) || (*(long *)(lVar1 + 0xa8) == 0)) ||
        (*(long *)(lVar1 + 0x58) == 0)) ||
       (((*(long *)(lVar1 + 0x18) == 0 || (*(long *)(lVar1 + 0x78) == 0)) ||
        ((*(long *)(lVar1 + 0x28) == 0 || (*(long *)(lVar1 + 0x38) == 0)))))) {
      msgfmt = "A required vector operation is not implemented.";
      error_code = -3;
      iVar2 = 0x442;
    }
    else {
      iVar2 = SUNMatGetID(Jac);
      if (iVar2 == 0) {
        iVar2 = cvLsDenseDQJac(t,y,fy,Jac,(CVodeMem)cvode_mem,tmp1);
        return iVar2;
      }
      iVar2 = SUNMatGetID(Jac);
      if (iVar2 == 3) {
        iVar2 = cvLsBandDQJac(t,y,fy,Jac,(CVodeMem)cvode_mem,tmp1,tmp2);
        return iVar2;
      }
      msgfmt = "unrecognized matrix type for cvLsDQJac";
      error_code = -3;
      iVar2 = 0x452;
    }
  }
  cvProcessError((CVodeMem)cvode_mem,error_code,iVar2,"cvLsDQJac",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes_ls.c"
                 ,msgfmt);
  return error_code;
}

Assistant:

int cvLsDQJac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
              void* cvode_mem, N_Vector tmp1, N_Vector tmp2,
              SUNDIALS_MAYBE_UNUSED N_Vector tmp3)
{
  CVodeMem cv_mem;
  int retval;

  /* access CVodeMem structure */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_LS_CVMEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* verify that Jac is non-NULL */
  if (Jac == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_LS_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }

  /* Verify that N_Vector supports required operations */
  if (cv_mem->cv_tempv->ops->nvcloneempty == NULL ||
      cv_mem->cv_tempv->ops->nvwrmsnorm == NULL ||
      cv_mem->cv_tempv->ops->nvlinearsum == NULL ||
      cv_mem->cv_tempv->ops->nvdestroy == NULL ||
      cv_mem->cv_tempv->ops->nvscale == NULL ||
      cv_mem->cv_tempv->ops->nvgetarraypointer == NULL ||
      cv_mem->cv_tempv->ops->nvsetarraypointer == NULL)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSG_LS_BAD_NVECTOR);
    return (CVLS_ILL_INPUT);
  }

  /* Call the matrix-structure-specific DQ approximation routine */
  if (SUNMatGetID(Jac) == SUNMATRIX_DENSE)
  {
    retval = cvLsDenseDQJac(t, y, fy, Jac, cv_mem, tmp1);
  }
  else if (SUNMatGetID(Jac) == SUNMATRIX_BAND)
  {
    retval = cvLsBandDQJac(t, y, fy, Jac, cv_mem, tmp1, tmp2);
  }
  else
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "unrecognized matrix type for cvLsDQJac");
    retval = CVLS_ILL_INPUT;
  }
  return (retval);
}